

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::make<std::shared_ptr<std::istream>,std::ifstream*>
          (any *this,basic_ifstream<char,_std::char_traits<char>_> **args)

{
  proxy *ppVar1;
  int local_1c;
  holder<std::shared_ptr<std::basic_istream<char,_std::char_traits<char>_>_>_> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<std::shared_ptr<std::istream>>,64ul,cs_impl::default_allocator_provider>
             ::alloc<std::ifstream*>
                       ((allocator_type<cs_impl::any::holder<std::shared_ptr<std::istream>>,64ul,cs_impl::default_allocator_provider>
                         *)holder<std::shared_ptr<std::istream>>::allocator,args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<std::shared_ptr<std::istream>>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}